

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

ON_String __thiscall ON_String::Left(ON_String *this,int count)

{
  int iVar1;
  char *s;
  ON_Internal_Empty_aString *pOVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  
  ON_String(this);
  s = *(char **)CONCAT44(in_register_00000034,count);
  pOVar2 = &empty_astring;
  if (s != (char *)0x0) {
    pOVar2 = (ON_Internal_Empty_aString *)(s + -0xc);
  }
  iVar1 = (pOVar2->header).string_length;
  if (iVar1 < in_EDX) {
    in_EDX = iVar1;
  }
  if (0 < in_EDX) {
    CopyToArray(this,in_EDX,s);
  }
  return (ON_String)(char *)this;
}

Assistant:

ON_String ON_String::Left(int count) const
{
  ON_String s;
  if ( count > Length() )
    count = Length();
  if ( count > 0 ) {
    s.CopyToArray( count, m_s );
  }
  return s;
}